

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcp_utils.h
# Opt level: O2

int timeval_comp(timeval *x,timeval *y)

{
  uint uVar1;
  
  timeval_align(x);
  timeval_align(y);
  uVar1 = 0xffffffff;
  if (y->tv_sec <= x->tv_sec) {
    if (y->tv_sec < x->tv_sec) {
      uVar1 = 1;
    }
    else if (y->tv_usec <= x->tv_usec) {
      uVar1 = (uint)(y->tv_usec < x->tv_usec);
    }
  }
  return uVar1;
}

Assistant:

inline static int timeval_comp(struct timeval *x, struct timeval *y) {
    timeval_align(x);
    timeval_align(y);
    if (x->tv_sec < y->tv_sec) {
        return -1;
    } else if (x->tv_sec > y->tv_sec) {
        return 1;
    } else if (x->tv_usec < y->tv_usec) {
        return -1;
    } else if (x->tv_usec > y->tv_usec) {
        return 1;
    } else {
        return 0;
    }
}